

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver2i.c
# Opt level: O1

Gia_Man_t * Gia_ManInterTest(Gia_Man_t *p)

{
  uint *puVar1;
  lit *end;
  void *pvVar2;
  Vec_Int_t *__ptr;
  int iVar3;
  uint uVar4;
  Aig_Man_t *pAig;
  Cnf_Dat_t *p_00;
  sat_solver2 *psVar5;
  int *piVar6;
  Vec_Ptr_t *pVVar7;
  Int2_Man_t *pIVar8;
  Gia_Man_t *p_01;
  uint uVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  timespec ts;
  int Lit;
  timespec local_78;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  Aig_Man_t *local_58;
  Vec_Int_t *local_50;
  sat_solver2 *local_48;
  ulong local_40;
  long local_38;
  
  iVar3 = clock_gettime(3,&local_78);
  if (iVar3 < 0) {
    lVar10 = 1;
  }
  else {
    lVar10 = SUB168(SEXT816(-0x20c49ba5e353f7cf) *
                    SEXT816(CONCAT44(local_78.tv_nsec._4_4_,(int)local_78.tv_nsec)),8);
    lVar10 = ((lVar10 >> 7) - (lVar10 >> 0x3f)) +
             CONCAT44(local_78.tv_sec._4_4_,(int)local_78.tv_sec) * -1000000;
  }
  if (p->nRegs != 0) {
    __assert_fail("Gia_ManRegNum(p) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver2i.c"
                  ,0xa8,"Gia_Man_t *Gia_ManInterTest(Gia_Man_t *)");
  }
  if (p->vCos->nSize != 1) {
    __assert_fail("Gia_ManCoNum(p) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver2i.c"
                  ,0xa9,"Gia_Man_t *Gia_ManInterTest(Gia_Man_t *)");
  }
  pAig = Gia_ManToAigSimple(p);
  p_00 = Cnf_Derive(pAig,1);
  psVar5 = sat_solver2_new();
  psVar5->fVerbose = 1;
  sat_solver2_setnvars(psVar5,p_00->nVars * 2 + 1);
  pVVar7 = pAig->vObjs;
  if (0 < pVVar7->nSize) {
    lVar11 = 0;
    do {
      pvVar2 = pVVar7->pArray[lVar11];
      if (((pvVar2 != (void *)0x0) && (-1 < p_00->pVarNums[*(int *)((long)pvVar2 + 0x24)])) &&
         ((*(uint *)((long)pvVar2 + 0x18) & 6) != 2)) {
        var_set_partA(psVar5,p_00->pVarNums[*(int *)((long)pvVar2 + 0x24)],1);
      }
      lVar11 = lVar11 + 1;
      pVVar7 = pAig->vObjs;
    } while (lVar11 < pVVar7->nSize);
  }
  if (0 < p_00->nClauses) {
    lVar11 = 0;
    do {
      uVar4 = sat_solver2_addclause(psVar5,p_00->pClauses[lVar11],p_00->pClauses[lVar11 + 1],-1);
      uVar9 = (psVar5->Mem).uPageMask & uVar4;
      if (uVar9 == 0) {
        __assert_fail("k",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satClause.h"
                      ,0x60,"clause *Sat_MemClause(Sat_Mem_t *, int, int)");
      }
      puVar1 = (uint *)((psVar5->Mem).pPages[(int)uVar4 >> ((byte)(psVar5->Mem).nPageSize & 0x1f)] +
                       (int)uVar9);
      *puVar1 = *puVar1 | 4;
      lVar11 = lVar11 + 1;
    } while (lVar11 < p_00->nClauses);
  }
  local_38 = lVar10;
  Cnf_DataLift(p_00,p_00->nVars);
  if (0 < p_00->nClauses) {
    lVar10 = 0;
    do {
      lVar11 = lVar10 + 1;
      sat_solver2_addclause(psVar5,p_00->pClauses[lVar10],p_00->pClauses[lVar10 + 1],-1);
      lVar10 = lVar11;
    } while (lVar11 < p_00->nClauses);
  }
  piVar6 = (int *)0x0;
  Cnf_DataLift(p_00,-p_00->nVars);
  uVar4 = pAig->nObjs[3];
  local_50 = (Vec_Int_t *)malloc(0x10);
  iVar3 = 0x10;
  if (0xe < uVar4) {
    iVar3 = uVar4 + 1;
  }
  local_50->nSize = 0;
  local_50->nCap = iVar3;
  local_48 = psVar5;
  if (iVar3 != 0) {
    piVar6 = (int *)malloc((long)iVar3 << 2);
  }
  psVar5 = local_48;
  local_50->pArray = piVar6;
  pVVar7 = pAig->vCis;
  local_58 = pAig;
  if (0 < pVVar7->nSize) {
    lVar10 = 0;
    do {
      uVar4 = p_00->pVarNums[*(int *)((long)pVVar7->pArray[lVar10] + 0x24)];
      uVar9 = p_00->nVars + uVar4;
      if ((int)(uVar9 | uVar4) < 0) {
        __assert_fail("iVarA >= 0 && iVarB >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver2.h"
                      ,0x117,"int sat_solver2_add_buffer(sat_solver2 *, int, int, int, int, int)");
      }
      local_78.tv_sec._0_4_ = uVar4 * 2;
      local_78.tv_sec._4_4_ = uVar9 * 2 + 1;
      sat_solver2_addclause(psVar5,(lit *)&local_78,(lit *)&local_78.tv_nsec,-1);
      local_78.tv_sec._0_4_ = uVar4 * 2 + 1;
      local_78.tv_sec._4_4_ = uVar9 * 2;
      sat_solver2_addclause(psVar5,(lit *)&local_78,(lit *)&local_78.tv_nsec,-1);
      Vec_IntPush(local_50,uVar4);
      lVar10 = lVar10 + 1;
      pVVar7 = local_58->vCis;
    } while (lVar10 < pVVar7->nSize);
  }
  psVar5 = local_48;
  if (0 < local_58->vCos->nSize) {
    uVar4 = p_00->pVarNums[*(int *)((long)*local_58->vCos->pArray + 0x24)];
    local_40 = (ulong)uVar4;
    iVar3 = p_00->nVars;
    uVar9 = iVar3 + uVar4;
    if ((int)(iVar3 * 2 | uVar4 | uVar9) < 0) {
      __assert_fail("iVarA >= 0 && iVarB >= 0 && iVarC >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver2.h"
                    ,0x143,"int sat_solver2_add_xor(sat_solver2 *, int, int, int, int, int, int)");
    }
    local_60 = uVar4 * 2;
    iVar12 = uVar4 * 2 + 1;
    local_78.tv_sec._4_4_ = uVar9 * 2 + 1;
    local_78.tv_nsec._0_4_ = iVar3 * 4 + 1;
    local_78.tv_sec._0_4_ = iVar12;
    local_68 = local_78.tv_sec._4_4_;
    local_64 = (int)local_78.tv_nsec;
    sat_solver2_addclause(local_48,(lit *)&local_78,(lit *)((long)&local_78.tv_nsec + 4),-1);
    local_78.tv_sec._0_4_ = iVar12;
    local_78.tv_sec._4_4_ = uVar9 * 2;
    local_78.tv_nsec._0_4_ = iVar3 << 2;
    sat_solver2_addclause(psVar5,(lit *)&local_78,(lit *)((long)&local_78.tv_nsec + 4),-1);
    iVar12 = local_60;
    local_78.tv_sec._0_4_ = local_60;
    local_78.tv_sec._4_4_ = local_68;
    end = (lit *)((long)&local_78.tv_nsec + 4);
    local_78.tv_nsec._0_4_ = iVar3 << 2;
    sat_solver2_addclause(psVar5,(lit *)&local_78,end,-1);
    local_78.tv_sec._0_4_ = iVar12;
    local_78.tv_nsec._0_4_ = local_64;
    local_78.tv_sec._4_4_ = uVar9 * 2;
    sat_solver2_addclause(psVar5,(lit *)&local_78,end,-1);
    __ptr = local_50;
    Vec_IntPush(local_50,(int)local_40);
    piVar6 = __ptr->pArray;
    pIVar8 = Int2_ManStart(psVar5,piVar6,__ptr->nSize);
    psVar5->pInt2 = pIVar8;
    local_5c = p_00->nVars << 2;
    iVar3 = sat_solver2_solve(psVar5,&local_5c,(lit *)&local_58,0,0,0,0);
    if (iVar3 == -1) {
      Sat_Solver2PrintStats(_stdout,psVar5);
      p_01 = (Gia_Man_t *)Int2_ManReadInterpolant(psVar5);
      Gia_ManPrintStats(p_01,(Gps_Par_t *)0x0);
      iVar12 = 3;
      iVar3 = clock_gettime(3,&local_78);
      if (iVar3 < 0) {
        lVar10 = -1;
      }
      else {
        lVar10 = CONCAT44(local_78.tv_nsec._4_4_,(int)local_78.tv_nsec) / 1000 +
                 CONCAT44(local_78.tv_sec._4_4_,(int)local_78.tv_sec) * 1000000;
      }
      lVar10 = lVar10 + local_38;
      Abc_Print(iVar12,"%s =","Total interpolation time");
      Abc_Print(iVar12,"%9.2f sec\n",(double)lVar10 / 1000000.0);
      if (piVar6 != (int *)0x0) {
        free(piVar6);
        __ptr->pArray = (int *)0x0;
      }
      free(__ptr);
      Cnf_DataFree(p_00);
      Aig_ManStop(local_58);
      sat_solver2_delete(psVar5);
      return p_01;
    }
    __assert_fail("status == l_False",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver2i.c"
                  ,0xda,"Gia_Man_t *Gia_ManInterTest(Gia_Man_t *)");
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

Gia_Man_t * Gia_ManInterTest( Gia_Man_t * p )
{
    sat_solver2 * pSat;
    Gia_Man_t * pInter;
    Aig_Man_t * pMan;
    Vec_Int_t * vGVars;
    Cnf_Dat_t * pCnf;
    Aig_Obj_t * pObj;
    int Lit, Cid, Var, status, i;
    abctime clk = Abc_Clock();
    assert( Gia_ManRegNum(p) == 0 );
    assert( Gia_ManCoNum(p) == 1 );

    // derive CNFs
    pMan = Gia_ManToAigSimple( p );
    pCnf = Cnf_Derive( pMan, 1 );

    // start the solver
    pSat = sat_solver2_new();
    pSat->fVerbose = 1;
    sat_solver2_setnvars( pSat, 2*pCnf->nVars+1 );

    // set A-variables (all used except PI/PO, which will be global variables)
    Aig_ManForEachObj( pMan, pObj, i )
        if ( pCnf->pVarNums[pObj->Id] >= 0 && !Aig_ObjIsCi(pObj) && !Aig_ObjIsCo(pObj) )
            var_set_partA( pSat, pCnf->pVarNums[pObj->Id], 1 );

    // add clauses of A
    for ( i = 0; i < pCnf->nClauses; i++ )
    {
        Cid = sat_solver2_addclause( pSat, pCnf->pClauses[i], pCnf->pClauses[i+1], -1 );
        clause2_set_partA( pSat, Cid, 1 ); // this API should be called for each clause of A
    }

    // add clauses of B (after shifting all CNF variables by pCnf->nVars)
    Cnf_DataLift( pCnf, pCnf->nVars );
    for ( i = 0; i < pCnf->nClauses; i++ )
        sat_solver2_addclause( pSat, pCnf->pClauses[i], pCnf->pClauses[i+1], -1 );
    Cnf_DataLift( pCnf, -pCnf->nVars );

    // add PI equality clauses
    vGVars = Vec_IntAlloc( Aig_ManCoNum(pMan)+1 );
    Aig_ManForEachCi( pMan, pObj, i )
    {
        Var = pCnf->pVarNums[pObj->Id];
        sat_solver2_add_buffer( pSat, Var, pCnf->nVars + Var, 0, 0, -1 );
        Vec_IntPush( vGVars, Var );
    }

    // add an XOR clause in the end
    Var = pCnf->pVarNums[Aig_ManCo(pMan,0)->Id];
    sat_solver2_add_xor( pSat, Var, pCnf->nVars + Var, 2*pCnf->nVars, 0, 0, -1 );
    Vec_IntPush( vGVars, Var );

    // start the interpolation manager
    pSat->pInt2 = Int2_ManStart( pSat, Vec_IntArray(vGVars), Vec_IntSize(vGVars) );

    // solve the problem
    Lit = toLitCond( 2*pCnf->nVars, 0 );
    status = sat_solver2_solve( pSat, &Lit, &Lit + 1, 0, 0, 0, 0 );
    assert( status == l_False );
    Sat_Solver2PrintStats( stdout, pSat );

    // derive interpolant
    pInter = (Gia_Man_t *)Int2_ManReadInterpolant( pSat );
    Gia_ManPrintStats( pInter, NULL );
    Abc_PrintTime( 1, "Total interpolation time", Abc_Clock() - clk );

    // clean up
    Vec_IntFree( vGVars );
    Cnf_DataFree( pCnf );
    Aig_ManStop( pMan );
    sat_solver2_delete( pSat );

    // return interpolant
    return pInter;
}